

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetadataTree.cpp
# Opt level: O2

ostream * __thiscall cali::internal::MetadataTree::print_statistics(MetadataTree *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"  Metadata tree: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," blocks, ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," nodes\n   ");
  MemoryPool::print_statistics(&this->m_mempool,poVar1);
  return os;
}

Assistant:

std::ostream& MetadataTree::print_statistics(std::ostream& os) const
{
    m_mempool.print_statistics(
        os << "  Metadata tree: " << m_num_blocks << " blocks, " << m_num_nodes << " nodes\n   "
    );

    return os;
}